

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

bool __thiscall cmCTestP4::LoadRevisions(cmCTestP4 *this)

{
  pointer pcVar1;
  cmCTest *this_00;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  pointer pbVar5;
  string range;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_changes;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_describe;
  OutputLogger errDescribe;
  OutputLogger err;
  ChangesParser out;
  ostringstream cmCTestLog_msg;
  _func_int **local_538 [2];
  _func_int *local_528 [2];
  vector<const_char_*,_std::allocator<const_char_*>_> local_518;
  char **local_4f8;
  undefined8 uStack_4f0;
  long local_4e8;
  pointer local_4d8;
  OutputLogger local_4d0;
  OutputLogger local_490;
  ChangesParser local_450;
  undefined1 local_338 [256];
  char *local_238;
  char *local_168;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> local_150;
  Revision local_130;
  
  local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetP4Options(this,&local_518);
  local_538[0] = local_528;
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_538,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length
            );
  std::__cxx11::string::append((char *)local_538);
  iVar2 = std::__cxx11::string::compare((char *)&(this->super_cmCTestGlobalVC).OldRevision);
  if ((iVar2 == 0) ||
     (iVar2 = std::__cxx11::string::compare((char *)&(this->super_cmCTestGlobalVC).NewRevision),
     iVar2 == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_338);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_338,"   At least one of the revisions ",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_338,"is unknown. No repository changes will be reported.\n",0x34);
    this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestP4.cxx"
                 ,0x193,(char *)local_450.super_LineParser.super_OutputParser._vptr_OutputParser,
                 false);
    if (local_450.super_LineParser.super_OutputParser._vptr_OutputParser !=
        (_func_int **)&local_450.super_LineParser.Prefix) {
      operator_delete(local_450.super_LineParser.super_OutputParser._vptr_OutputParser,
                      (ulong)(local_450.super_LineParser.Prefix + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_338);
    std::ios_base::~ios_base((ios_base *)(local_338 + 0x70));
    bVar4 = false;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::append((char *)local_538);
    pcVar3 = (char *)std::__cxx11::string::_M_append
                               (pcVar3,(ulong)(this->super_cmCTestGlobalVC).OldRevision._M_dataplus.
                                              _M_p);
    pcVar3 = (char *)std::__cxx11::string::append(pcVar3);
    std::__cxx11::string::_M_append
              (pcVar3,(ulong)(this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
    local_338._0_8_ = "changes";
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_518,(char **)local_338);
    local_338._0_8_ = local_538[0];
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_518,(char **)local_338);
    local_338._0_8_ = (_func_int **)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_518,(char **)local_338);
    ChangesParser::ChangesParser(&local_450,this,"p4_changes-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&local_490,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_changes-err> ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->ChangeLists,
                      (this->ChangeLists).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    cmCTestVC::RunChild((cmCTestVC *)this,
                        local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&local_450,
                        (OutputParser *)&local_490,(char *)0x0,Auto);
    local_4d8 = (this->ChangeLists).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (this->ChangeLists).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_4d8 != pbVar5) {
      local_4f8 = (char **)0x0;
      uStack_4f0 = 0;
      local_4e8 = 0;
      do {
        SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_4f8);
        local_338._0_8_ = "describe";
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_4f8,(char **)local_338)
        ;
        local_338._0_8_ = "-s";
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_4f8,(char **)local_338)
        ;
        pbVar5 = pbVar5 + -1;
        local_338._0_8_ = (pbVar5->_M_dataplus)._M_p;
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_4f8,(char **)local_338)
        ;
        local_338._0_8_ = (_func_int **)0x0;
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_4f8,(char **)local_338)
        ;
        DescribeParser::DescribeParser((DescribeParser *)local_338,this,"p4_describe-out> ");
        cmProcessTools::OutputLogger::OutputLogger
                  (&local_4d0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_describe-err> ")
        ;
        cmCTestVC::RunChild((cmCTestVC *)this,local_4f8,(OutputParser *)local_338,
                            (OutputParser *)&local_4d0,(char *)0x0,Auto);
        local_4d0.super_LineParser.super_OutputParser._vptr_OutputParser =
             (_func_int **)&PTR__LineParser_0094e948;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0.super_LineParser.Line._M_dataplus._M_p !=
            &local_4d0.super_LineParser.Line.field_2) {
          operator_delete(local_4d0.super_LineParser.Line._M_dataplus._M_p,
                          local_4d0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
        }
        local_338._0_8_ = &PTR__DescribeParser_0094bef0;
        cmCTestVC::Revision::~Revision(&local_130);
        std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector
                  (&local_150);
        if (local_168 != (char *)0x0) {
          operator_delete__(local_168);
        }
        if (local_238 != (char *)0x0) {
          operator_delete__(local_238);
        }
        local_338._0_8_ = &PTR__LineParser_0094e948;
        if ((undefined1 *)local_338._24_8_ != local_338 + 0x28) {
          operator_delete((void *)local_338._24_8_,local_338._40_8_ + 1);
        }
      } while (pbVar5 != local_4d8);
      if (local_4f8 != (char **)0x0) {
        operator_delete(local_4f8,local_4e8 - (long)local_4f8);
      }
    }
    local_490.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_0094e948;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490.super_LineParser.Line._M_dataplus._M_p !=
        &local_490.super_LineParser.Line.field_2) {
      operator_delete(local_490.super_LineParser.Line._M_dataplus._M_p,
                      local_490.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_450.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__ChangesParser_0094bea8;
    if (local_450.RegexIdentify.program != (char *)0x0) {
      operator_delete__(local_450.RegexIdentify.program);
    }
    local_450.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_0094e948;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450.super_LineParser.Line._M_dataplus._M_p !=
        &local_450.super_LineParser.Line.field_2) {
      operator_delete(local_450.super_LineParser.Line._M_dataplus._M_p,
                      local_450.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    bVar4 = true;
  }
  if (local_538[0] != local_528) {
    operator_delete(local_538[0],(ulong)(local_528[0] + 1));
  }
  if (local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool cmCTestP4::LoadRevisions()
{
  std::vector<char const*> p4_changes;
  this->SetP4Options(p4_changes);

  // Use 'p4 changes ...@old,new' to get a list of changelists
  std::string range = this->SourceDirectory + "/...";

  // If any revision is unknown it means we couldn't contact the server.
  // Do not process updates
  if (this->OldRevision == "<unknown>" || this->NewRevision == "<unknown>") {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   At least one of the revisions "
                 << "is unknown. No repository changes will be reported.\n");
    return false;
  }

  range.append("@")
    .append(this->OldRevision)
    .append(",")
    .append(this->NewRevision);

  p4_changes.push_back("changes");
  p4_changes.push_back(range.c_str());
  p4_changes.push_back(nullptr);

  ChangesParser out(this, "p4_changes-out> ");
  OutputLogger err(this->Log, "p4_changes-err> ");

  this->ChangeLists.clear();
  this->RunChild(p4_changes.data(), &out, &err);

  if (this->ChangeLists.empty()) {
    return true;
  }

  // p4 describe -s ...@1111111,2222222
  std::vector<char const*> p4_describe;
  for (std::string const& i : cmReverseRange(this->ChangeLists)) {
    this->SetP4Options(p4_describe);
    p4_describe.push_back("describe");
    p4_describe.push_back("-s");
    p4_describe.push_back(i.c_str());
    p4_describe.push_back(nullptr);

    DescribeParser outDescribe(this, "p4_describe-out> ");
    OutputLogger errDescribe(this->Log, "p4_describe-err> ");
    this->RunChild(p4_describe.data(), &outDescribe, &errDescribe);
  }
  return true;
}